

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ProcessScript(jx9 *pEngine,jx9_vm **ppVm,SyString *pScript,sxi32 iFlags,char *zFilePath)

{
  sxu32 sVar1;
  sxi32 sVar2;
  jx9_vm *pVm_00;
  sxu32 nErr;
  int rc;
  jx9_vm *pVm;
  char *zFilePath_local;
  sxi32 iFlags_local;
  SyString *pScript_local;
  jx9_vm **ppVm_local;
  jx9 *pEngine_local;
  
  pVm_00 = (jx9_vm *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x6e8);
  if (pVm_00 == (jx9_vm *)0x0) {
    if (ppVm != (jx9_vm **)0x0) {
      *ppVm = (jx9_vm *)0x0;
    }
    pEngine_local._4_4_ = -1;
  }
  else {
    zFilePath_local._4_4_ = iFlags;
    if (iFlags < 0) {
      zFilePath_local._4_4_ = 0;
    }
    sVar2 = jx9VmInit(pVm_00,pEngine);
    if (sVar2 == 0) {
      if (zFilePath != (char *)0x0) {
        jx9VmPushFilePath(pVm_00,zFilePath,-1,'\x01',(sxi32 *)0x0);
      }
      SyBlobReset(&(pEngine->xConf).sErrConsumer);
      jx9CompileScript(pVm_00,pScript,zFilePath_local._4_4_);
      if (((pVm_00->sCodeGen).nErr == 0) && (pVm_00 != (jx9_vm *)0x0)) {
        sVar2 = jx9VmMakeReady(pVm_00);
        if (sVar2 == 0) {
          jx9_vm_config(pVm_00,2,"./");
          if (pEngine->pVms == (jx9_vm *)0x0) {
            pEngine->pVms = pVm_00;
          }
          else {
            pVm_00->pNext = pEngine->pVms;
            pEngine->pVms->pPrev = pVm_00;
            pEngine->pVms = pVm_00;
          }
          pEngine->iVm = pEngine->iVm + 1;
          *ppVm = pVm_00;
          pEngine_local._4_4_ = 0;
        }
        else {
          SyMemBackendRelease((SyMemBackend *)pVm_00);
          SyMemBackendPoolFree(&pEngine->sAllocator,pVm_00);
          *ppVm = (jx9_vm *)0x0;
          pEngine_local._4_4_ = -0x47;
        }
      }
      else {
        sVar1 = (pVm_00->sCodeGen).nErr;
        SyMemBackendRelease((SyMemBackend *)pVm_00);
        SyMemBackendPoolFree(&pEngine->sAllocator,pVm_00);
        if (ppVm != (jx9_vm **)0x0) {
          *ppVm = (jx9_vm *)0x0;
        }
        pEngine_local._4_4_ = 0;
        if (sVar1 != 0) {
          pEngine_local._4_4_ = -0x46;
        }
      }
    }
    else {
      SyMemBackendPoolFree(&pEngine->sAllocator,pVm_00);
      if (ppVm != (jx9_vm **)0x0) {
        *ppVm = (jx9_vm *)0x0;
      }
      pEngine_local._4_4_ = -0x47;
    }
  }
  return pEngine_local._4_4_;
}

Assistant:

static sxi32 ProcessScript(
	jx9 *pEngine,          /* Running JX9 engine */
	jx9_vm **ppVm,         /* OUT: A pointer to the virtual machine */
	SyString *pScript,     /* Raw JX9 script to compile */
	sxi32 iFlags,          /* Compile-time flags */
	const char *zFilePath  /* File path if script come from a file. NULL otherwise */
	)
{
	jx9_vm *pVm;
	int rc;
	/* Allocate a new virtual machine */
	pVm = (jx9_vm *)SyMemBackendPoolAlloc(&pEngine->sAllocator, sizeof(jx9_vm));
	if( pVm == 0 ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here. */
		if( ppVm ){
			*ppVm = 0;
		}
		return JX9_NOMEM;
	}
	if( iFlags < 0 ){
		/* Default compile-time flags */
		iFlags = 0;
	}
	/* Initialize the Virtual Machine */
	rc = jx9VmInit(pVm, &(*pEngine));
	if( rc != JX9_OK ){
		SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
		if( ppVm ){
			*ppVm = 0;
		}
		return JX9_VM_ERR;
	}
	if( zFilePath ){
		/* Push processed file path */
		jx9VmPushFilePath(pVm, zFilePath, -1, TRUE, 0);
	}
	/* Reset the error message consumer */
	SyBlobReset(&pEngine->xConf.sErrConsumer);
	/* Compile the script */
	jx9CompileScript(pVm, &(*pScript), iFlags);
	if( pVm->sCodeGen.nErr > 0 || pVm == 0){
		sxu32 nErr = pVm->sCodeGen.nErr;
		/* Compilation error or null ppVm pointer, release this VM */
		SyMemBackendRelease(&pVm->sAllocator);
		SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
		if( ppVm ){
			*ppVm = 0;
		}
		return nErr > 0 ? JX9_COMPILE_ERR : JX9_OK;
	}
	/* Prepare the virtual machine for bytecode execution */
	rc = jx9VmMakeReady(pVm);
	if( rc != JX9_OK ){
		goto Release;
	}
	/* Install local import path which is the current directory */
	jx9_vm_config(pVm, JX9_VM_CONFIG_IMPORT_PATH, "./");
#if defined(JX9_ENABLE_THREADS)
	if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE ){
		 /* Associate a recursive mutex with this instance */
		 pVm->pMutex = SyMutexNew(sJx9MPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pVm->pMutex == 0 ){
			 goto Release;
		 }
	 }
#endif
	/* Script successfully compiled, link to the list of active virtual machines */
	MACRO_LD_PUSH(pEngine->pVms, pVm);
	pEngine->iVm++;
	/* Point to the freshly created VM */
	*ppVm = pVm;
	/* Ready to execute JX9 bytecode */
	return JX9_OK;
Release:
	SyMemBackendRelease(&pVm->sAllocator);
	SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
	*ppVm = 0;
	return JX9_VM_ERR;
}